

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O1

FT_Error af_axis_hints_new_edge
                   (AF_AxisHints axis,FT_Int fpos,AF_Direction dir,FT_Bool top_to_bottom_hinting,
                   FT_Memory memory,AF_Edge_conflict *anedge)

{
  AF_Edge_conflict pAVar1;
  uint uVar2;
  undefined6 uVar3;
  uint uVar4;
  AF_Edge_conflict pAVar5;
  AF_Edge_conflict pAVar6;
  long lVar7;
  AF_Edge_conflict pAVar8;
  byte bVar9;
  FT_Error error;
  FT_Error local_40;
  uint local_3c;
  AF_EdgeRec *local_38;
  
  bVar9 = 0;
  local_40 = 0;
  if (axis->num_edges < 0xc) {
    if (axis->edges == (AF_Edge_conflict)0x0) {
      axis->edges = (axis->embedded).edges;
      axis->max_edges = 0xc;
    }
  }
  else {
    uVar2 = axis->max_edges;
    if (uVar2 <= axis->num_edges) {
      if (0x1745d16 < uVar2) {
        local_40 = 0x40;
LAB_0026fe4f:
        pAVar5 = (AF_Edge_conflict)0x0;
        goto LAB_0026fdda;
      }
      uVar4 = (uVar2 >> 2) + uVar2 + 4;
      local_3c = 0x1745d17;
      if (uVar4 < 0x1745d17) {
        local_3c = uVar4;
      }
      local_38 = (axis->embedded).edges;
      if (axis->edges == local_38) {
        pAVar5 = (AF_Edge_conflict)0x0;
        pAVar6 = (AF_Edge_conflict)
                 ft_mem_realloc(memory,0x58,0,(ulong)local_3c,(void *)0x0,&local_40);
        axis->edges = pAVar6;
        if (local_40 != 0) goto LAB_0026fdda;
        memcpy(pAVar6,local_38,0x420);
      }
      else {
        pAVar5 = (AF_Edge_conflict)
                 ft_mem_realloc(memory,0x58,(ulong)uVar2,(ulong)local_3c,axis->edges,&local_40);
        axis->edges = pAVar5;
        if (local_40 != 0) goto LAB_0026fe4f;
      }
      axis->max_edges = local_3c;
    }
  }
  pAVar6 = axis->edges;
  pAVar5 = pAVar6 + axis->num_edges;
  if ((ulong)axis->num_edges != 0) {
    do {
      if (top_to_bottom_hinting == '\0') {
        if (pAVar5[-1].fpos < fpos) break;
      }
      else if (fpos < pAVar5[-1].fpos) break;
      if ((pAVar5[-1].fpos == fpos) && (axis->major_dir == dir)) break;
      pAVar1 = pAVar5 + -1;
      pAVar8 = pAVar1;
      for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
        uVar3 = *(undefined6 *)&pAVar8->field_0x2;
        pAVar5->fpos = pAVar8->fpos;
        *(undefined6 *)&pAVar5->field_0x2 = uVar3;
        pAVar8 = (AF_Edge_conflict)((long)pAVar8 + (ulong)bVar9 * -0x10 + 8);
        pAVar5 = (AF_Edge_conflict)((long)pAVar5 + (ulong)bVar9 * -0x10 + 8);
      }
      pAVar5 = pAVar1;
    } while (pAVar6 < pAVar1);
  }
  axis->num_edges = axis->num_edges + 1;
LAB_0026fdda:
  *anedge = pAVar5;
  return local_40;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_axis_hints_new_edge( AF_AxisHints  axis,
                          FT_Int        fpos,
                          AF_Direction  dir,
                          FT_Bool       top_to_bottom_hinting,
                          FT_Memory     memory,
                          AF_Edge      *anedge )
  {
    FT_Error  error = FT_Err_Ok;
    AF_Edge   edge  = NULL;
    AF_Edge   edges;


    if ( axis->num_edges < AF_EDGES_EMBEDDED )
    {
      if ( !axis->edges )
      {
        axis->edges     = axis->embedded.edges;
        axis->max_edges = AF_EDGES_EMBEDDED;
      }
    }
    else if ( axis->num_edges >= axis->max_edges )
    {
      FT_UInt  old_max = axis->max_edges;
      FT_UInt  new_max = old_max;
      FT_UInt  big_max = FT_INT_MAX / sizeof ( *edge );


      if ( old_max >= big_max )
      {
        error = FT_THROW( Out_Of_Memory );
        goto Exit;
      }

      new_max += ( new_max >> 2 ) + 4;
      if ( new_max < old_max || new_max > big_max )
        new_max = big_max;

      if ( axis->edges == axis->embedded.edges )
      {
        if ( FT_NEW_ARRAY( axis->edges, new_max ) )
          goto Exit;
        ft_memcpy( axis->edges, axis->embedded.edges,
                   sizeof ( axis->embedded.edges ) );
      }
      else
      {
        if ( FT_RENEW_ARRAY( axis->edges, old_max, new_max ) )
          goto Exit;
      }

      axis->max_edges = new_max;
    }

    edges = axis->edges;
    edge  = edges + axis->num_edges;

    while ( edge > edges )
    {
      if ( top_to_bottom_hinting ? ( edge[-1].fpos > fpos )
                                 : ( edge[-1].fpos < fpos ) )
        break;

      /* we want the edge with same position and minor direction */
      /* to appear before those in the major one in the list     */
      if ( edge[-1].fpos == fpos && dir == axis->major_dir )
        break;

      edge[0] = edge[-1];
      edge--;
    }

    axis->num_edges++;

  Exit:
    *anedge = edge;
    return error;
  }